

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O0

void mainchan_send_eof(Channel *chan)

{
  long lVar1;
  LogContext *ctx;
  _Bool _Var2;
  char *event;
  PacketProtocolLayer *ppl;
  mainchan *mc;
  Channel *chan_local;
  
  if (chan->vt == &mainchan_channelvt) {
    lVar1 = *(long *)&chan[-4].initial_fixed_window_size;
    if (((ulong)chan[-1].vt & 0x100) == 0) {
      _Var2 = seat_eof(*(Seat **)(*(long *)&chan[-4].initial_fixed_window_size + 0x48));
      if ((_Var2) || (((ulong)chan[-1].vt & 0x10000) != 0)) {
        sshfwd_write_eof(*(SshChannel **)&chan[-5].initial_fixed_window_size);
        ctx = *(LogContext **)(lVar1 + 0x40);
        event = dupprintf("Sent EOF message");
        logevent_and_free(ctx,event);
        *(undefined1 *)((long)&chan[-1].vt + 1) = 1;
        ssh_set_wants_user_input((ConnectionLayer *)chan[-3].vt,false);
      }
    }
    return;
  }
  __assert_fail("chan->vt == &mainchan_channelvt",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/mainchan.c",
                0x164,"void mainchan_send_eof(Channel *)");
}

Assistant:

static void mainchan_send_eof(Channel *chan)
{
    assert(chan->vt == &mainchan_channelvt);
    mainchan *mc = container_of(chan, mainchan, chan);
    PacketProtocolLayer *ppl = mc->ppl; /* for ppl_logevent */

    if (!mc->eof_sent && (seat_eof(mc->ppl->seat) || mc->got_pty)) {
        /*
         * Either seat_eof told us that the front end wants us to
         * close the outgoing side of the connection as soon as we see
         * EOF from the far end, or else we've unilaterally decided to
         * do that because we've allocated a remote pty and hence EOF
         * isn't a particularly meaningful concept.
         */
        sshfwd_write_eof(mc->sc);
        ppl_logevent("Sent EOF message");
        mc->eof_sent = true;
        ssh_set_wants_user_input(mc->cl, false); /* stop reading from stdin */
    }
}